

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264.c
# Opt level: O0

int h264_pred_weight_table(bitstream *str,h264_slice *slice,h264_pred_weight_table *table)

{
  uint uVar1;
  uint uVar2;
  h264_pred_weight_table *in_RDX;
  bitstream *in_RSI;
  int i;
  int ret;
  uint in_stack_ffffffffffffffe0;
  uint uVar3;
  
  uVar3 = 0;
  uVar1 = vs_ue((bitstream *)in_RDX,(uint32_t *)(ulong)in_stack_ffffffffffffffe0);
  uVar1 = uVar1 | uVar3;
  uVar3 = vs_ue((bitstream *)in_RDX,(uint32_t *)CONCAT44(uVar1,in_stack_ffffffffffffffe0));
  uVar3 = uVar3 | uVar1;
  for (uVar1 = 0; uVar1 <= *(uint *)&in_RSI[2].bytes; uVar1 = uVar1 + 1) {
    uVar2 = h264_pred_weight_table_entry
                      (in_RSI,in_RDX,(h264_pred_weight_table_entry *)CONCAT44(uVar3,uVar1));
    uVar3 = uVar2 | uVar3;
  }
  if (*(uint *)&in_RSI[1].bytes % 5 == 1) {
    for (uVar1 = 0; uVar1 <= *(uint *)((long)&in_RSI[2].bytes + 4); uVar1 = uVar1 + 1) {
      uVar2 = h264_pred_weight_table_entry
                        (in_RSI,in_RDX,(h264_pred_weight_table_entry *)CONCAT44(uVar3,uVar1));
      uVar3 = uVar2 | uVar3;
    }
  }
  return uVar3;
}

Assistant:

int h264_pred_weight_table(struct bitstream *str, struct h264_slice *slice, struct h264_pred_weight_table *table) {
	int ret = 0;
	ret |= vs_ue(str, &table->luma_log2_weight_denom);
	ret |= vs_ue(str, &table->chroma_log2_weight_denom);
	int i;
	for (i = 0; i <= slice->num_ref_idx_l0_active_minus1; i++)
		ret |= h264_pred_weight_table_entry(str, table, &table->l0[i]);
	if (slice->slice_type % 5 == 1)
		for (i = 0; i <= slice->num_ref_idx_l1_active_minus1; i++)
			ret |= h264_pred_weight_table_entry(str, table, &table->l1[i]);
	return ret;
}